

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::IsIdentity(ON_Xform *this,double zero_tolerance)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = false;
  if ((0.0 <= zero_tolerance) && (bVar5 = false, zero_tolerance < 1.23432101234321e+308)) {
    uVar3 = 0;
    if (ABS(1.0 - this->m_xform[0][0]) <= zero_tolerance) {
      pdVar2 = this->m_xform[3] + 3;
      bVar5 = false;
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar4 + 8))) {
          pdVar2 = (double *)((long)this->m_xform[0] + lVar4 + 0x10);
          goto LAB_0068745b;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar4 + 0x10))) {
          pdVar2 = (double *)((long)this->m_xform[0] + lVar4 + 0x18);
          goto LAB_0068745b;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[0] + lVar4 + 0x18))) {
          pdVar2 = (double *)((long)this->m_xform[1] + lVar4);
          goto LAB_0068745b;
        }
        if (zero_tolerance < ABS(*(double *)((long)this->m_xform[1] + lVar4))) {
          pdVar2 = (double *)((long)this->m_xform[1] + lVar4 + 8);
          goto LAB_0068745b;
        }
        bVar5 = 1 < uVar3;
        if ((int)lVar4 == 0x50) goto LAB_0068745b;
        uVar3 = uVar3 + 1;
        lVar1 = lVar4 + 0x28;
      } while (ABS(1.0 - *(double *)((long)this->m_xform[1] + lVar4 + 8)) <= zero_tolerance);
      pdVar2 = (double *)((long)this->m_xform[1] + lVar4 + 0x10);
    }
    else {
      pdVar2 = this->m_xform[0] + 1;
      bVar5 = false;
    }
LAB_0068745b:
    if (!bVar5) {
      return false;
    }
    bVar5 = ABS(1.0 - *pdVar2) <= zero_tolerance;
  }
  return bVar5;
}

Assistant:

bool ON_Xform::IsIdentity( double zero_tolerance ) const
{
  // The code below will return false if m_xform[][] contains
  // a nan value.

  if (!(zero_tolerance >= 0.0 && zero_tolerance < ON_UNSET_POSITIVE_VALUE))
    return false;

  const double* v = &m_xform[0][0];
  for ( int i = 0; i < 3; i++ )
  {
    if ( !(fabs(1.0 - *v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
    if ( !(fabs(*v++) <= zero_tolerance) )
      return false;
  }
  if ( !(fabs( 1.0 - *v ) <= zero_tolerance) )
    return false;

  return true;
}